

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::
VisitMapKey<google::protobuf::internal::UntypedMapBase,google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)::__1>
          (internal *this,MapKey *map_key,UntypedMapBase *map,anon_class_16_2_3fe397bd f)

{
  MapKey *map_00;
  bool v;
  CppType CVar1;
  uint v_00;
  uint32_t v_01;
  unsigned_long v_02;
  uint64_t v_03;
  string_view local_70;
  ViewType local_60;
  bool local_49;
  unsigned_long local_48;
  unsigned_long local_40;
  uint local_38;
  uint local_34;
  MapKey *local_30;
  UntypedMapBase *map_local;
  MapKey *map_key_local;
  anon_class_16_2_3fe397bd f_local;
  
  f_local.this = f.this;
  local_30 = map_key;
  map_local = (UntypedMapBase *)this;
  map_key_local = (MapKey *)map;
  CVar1 = MapKey::type((MapKey *)this);
  map_00 = local_30;
  switch(CVar1) {
  case CPPTYPE_INT32:
    v_00 = MapKey::GetInt32Value((MapKey *)map_local);
    local_34 = TransparentSupport<unsigned_int>::ToView(v_00);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,(KeyMapBase<unsigned_int> *)map_00,&local_34);
    break;
  case CPPTYPE_INT64:
    v_02 = MapKey::GetInt64Value((MapKey *)map_local);
    local_40 = TransparentSupport<unsigned_long>::ToView(v_02);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,(KeyMapBase<unsigned_long> *)map_00,&local_40);
    break;
  case CPPTYPE_UINT32:
    v_01 = MapKey::GetUInt32Value((MapKey *)map_local);
    local_38 = TransparentSupport<unsigned_int>::ToView(v_01);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,(KeyMapBase<unsigned_int> *)map_00,&local_38);
    break;
  case CPPTYPE_UINT64:
    v_03 = MapKey::GetUInt64Value((MapKey *)map_local);
    local_48 = TransparentSupport<unsigned_long>::ToView(v_03);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,(KeyMapBase<unsigned_long> *)map_00,&local_48);
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                ,0x46);
  case CPPTYPE_BOOL:
    v = MapKey::GetBoolValue((MapKey *)map_local);
    local_49 = TransparentSupport<bool>::ToView(v);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,(KeyMapBase<bool> *)map_00,&local_49);
    break;
  case CPPTYPE_STRING:
    local_70 = MapKey::GetStringValue((MapKey *)map_local);
    local_60 = TransparentSupport<std::__cxx11::string>::
               ToView<std::basic_string_view<char,std::char_traits<char>>>(&local_70);
    f_local.node._7_1_ =
         MapFieldBase::
         InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)
         ::$_1::operator()(&map_key_local,
                           (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)map_00,&local_60);
  }
  return f_local.node._7_1_;
}

Assistant:

auto VisitMapKey(const MapKey& map_key, Map& map, F f) {
  switch (map_key.type()) {
#define HANDLE_TYPE(CPPTYPE, Type, KeyBaseType)                               \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                                  \
    using KMB = KeyMapBase<KeyBaseType>;                                      \
    return f(                                                                 \
        static_cast<                                                          \
            std::conditional_t<std::is_const_v<Map>, const KMB&, KMB&>>(map), \
        TransparentSupport<KeyBaseType>::ToView(map_key.Get##Type##Value())); \
  }
    HANDLE_TYPE(INT32, Int32, uint32_t);
    HANDLE_TYPE(UINT32, UInt32, uint32_t);
    HANDLE_TYPE(INT64, Int64, uint64_t);
    HANDLE_TYPE(UINT64, UInt64, uint64_t);
    HANDLE_TYPE(BOOL, Bool, bool);
    HANDLE_TYPE(STRING, String, std::string);
#undef HANDLE_TYPE
    default:
      Unreachable();
  }
}